

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

void __thiscall PClass::Derive(PClass *this,PClass *newclass,FName *name)

{
  newclass->bRuntimeClass = true;
  newclass->ParentClass = this;
  newclass->ConstructNative = this->ConstructNative;
  (newclass->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
  Symbols.ParentSymbolTable =
       &(this->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
        Symbols;
  (newclass->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index = name->Index;
  FString::Format(&(newclass->super_PNativeStruct).super_PStruct.super_PNamedType.
                   super_PCompoundType.super_PType.mDescriptiveName,"Class<%s>",
                  FName::NameData.NameArray[name->Index].Text);
  return;
}

Assistant:

void PClass::Derive(PClass *newclass, FName name)
{
	newclass->bRuntimeClass = true;
	newclass->ParentClass = this;
	newclass->ConstructNative = ConstructNative;
	newclass->Symbols.SetParentTable(&this->Symbols);
	newclass->TypeName = name;
	newclass->mDescriptiveName.Format("Class<%s>", name.GetChars());
}